

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::Initialize
          (ChLinkMateGeneric *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChFrame<double> *mpos1,
          ChFrame<double> *mpos2)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  peVar1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == peVar2) {
    __assert_fail("mbody1.get() != mbody2.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMate.cpp"
                  ,0xef,
                  "virtual void chrono::ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame>, std::shared_ptr<ChBodyFrame>, bool, ChFrame<>, ChFrame<>)"
                 );
  }
  (this->super_ChLinkMate).super_ChLink.Body1 = peVar1;
  (this->super_ChLinkMate).super_ChLink.Body2 = peVar2;
  iVar3 = (*(peVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar4 = (*(((this->super_ChLinkMate).super_ChLink.Body2)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChLinkMask::SetTwoBodiesVariables
            (&this->mask,(ChVariables *)CONCAT44(extraout_var,iVar3),
             (ChVariables *)CONCAT44(extraout_var_00,iVar4));
  if (pos_are_relative) {
    ChFrame<double>::operator=(&this->frame1,mpos1);
    ChFrame<double>::operator=(&this->frame2,mpos2);
    return;
  }
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body1,mpos1,&this->frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body2,mpos2,&this->frame2);
  return;
}

Assistant:

void ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                   std::shared_ptr<ChBodyFrame> mbody2,
                                   bool pos_are_relative,
                                   ChFrame<> mpos1,
                                   ChFrame<> mpos2) {
    assert(mbody1.get() != mbody2.get());

    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();
    // this->SetSystem(mbody1->GetSystem());

    this->mask.SetTwoBodiesVariables(&Body1->Variables(), &Body2->Variables());

    if (pos_are_relative) {
        this->frame1 = mpos1;
        this->frame2 = mpos2;
    } else {
        // from abs to body-rel
        static_cast<ChFrame<>*>(this->Body1)->TransformParentToLocal(mpos1, this->frame1);
        static_cast<ChFrame<>*>(this->Body2)->TransformParentToLocal(mpos2, this->frame2);
    }
}